

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O2

void ngram_model_set_map_words(ngram_model_t *base,char **words,int32 n_words)

{
  int32 iVar1;
  char **ppcVar2;
  logmath_t *plVar3;
  char *pcVar4;
  void *val;
  long lVar5;
  void *pvVar6;
  
  if (base->writable != '\0') {
    for (lVar5 = 0; lVar5 < base->n_words; lVar5 = lVar5 + 1) {
      ckd_free(base->word_str[lVar5]);
    }
  }
  ckd_free(base->word_str);
  ckd_free_2d(base[1].lmath);
  base->writable = '\x01';
  base->n_1g_alloc = n_words;
  base->n_words = n_words;
  ppcVar2 = (char **)__ckd_calloc__((long)n_words,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                                    ,0x290);
  base->word_str = ppcVar2;
  plVar3 = (logmath_t *)
           __ckd_calloc_2d__((long)n_words,(long)base[1].refcount,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                             ,0x293);
  base[1].lmath = plVar3;
  hash_table_empty(base->wid);
  val = (void *)0x0;
  pvVar6 = (void *)(ulong)(uint)n_words;
  if (n_words < 1) {
    pvVar6 = val;
  }
  for (; val != pvVar6; val = (void *)((long)val + 1)) {
    pcVar4 = __ckd_salloc__(words[(long)val],
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_set.c"
                            ,0x297);
    base->word_str[(long)val] = pcVar4;
    hash_table_enter(base->wid,base->word_str[(long)val],val);
    for (lVar5 = 0; lVar5 < base[1].refcount; lVar5 = lVar5 + 1) {
      iVar1 = ngram_wid(*(ngram_model_t **)(base[1].n_counts + lVar5 * 2),base->word_str[(long)val])
      ;
      *(int32 *)((long)(&((base[1].lmath)->t).table)[(long)val] + lVar5 * 4) = iVar1;
    }
  }
  return;
}

Assistant:

void
ngram_model_set_map_words(ngram_model_t * base,
                          const char **words, int32 n_words)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* Recreate the word mapping. */
    if (base->writable) {
        for (i = 0; i < base->n_words; ++i) {
            ckd_free(base->word_str[i]);
        }
    }
    ckd_free(base->word_str);
    ckd_free_2d((void **) set->widmap);
    base->writable = TRUE;
    base->n_words = base->n_1g_alloc = n_words;
    base->word_str = ckd_calloc(n_words, sizeof(*base->word_str));
    set->widmap =
        (int32 **) ckd_calloc_2d(n_words, set->n_models,
                                 sizeof(**set->widmap));
    hash_table_empty(base->wid);
    for (i = 0; i < n_words; ++i) {
        int32 j;
        base->word_str[i] = ckd_salloc(words[i]);
        (void) hash_table_enter_int32(base->wid, base->word_str[i], i);
        for (j = 0; j < set->n_models; ++j) {
            set->widmap[i][j] = ngram_wid(set->lms[j], base->word_str[i]);
        }
    }
}